

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O0

Error __thiscall asmjit::VMemMgr::shrink(VMemMgr *this,void *p,size_t used)

{
  Error EVar1;
  MemNode *pMVar2;
  ulong uVar3;
  ulong uVar4;
  long in_RDX;
  uint8_t *in_RSI;
  pthread_mutex_t *in_RDI;
  bool bVar5;
  bool stop;
  size_t usedBlocks;
  size_t cont;
  size_t bit;
  size_t cbits;
  size_t ubits;
  size_t *cp;
  size_t *up;
  size_t i;
  size_t bitpos;
  size_t offset;
  MemNode *node;
  AutoLock locked;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  size_t local_98;
  size_t *local_90;
  size_t *local_88;
  void *in_stack_ffffffffffffffa8;
  pthread_mutex_t *__mutex;
  Error local_34;
  
  if (in_RSI == (uint8_t *)0x0) {
    return 0;
  }
  if (in_RDX == 0) {
    EVar1 = release((VMemMgr *)0x0,in_stack_ffffffffffffffa8);
    return EVar1;
  }
  __mutex = in_RDI;
  pthread_mutex_lock(in_RDI);
  pMVar2 = vMemMgrFindNodeByPtr((VMemMgr *)&in_RDI->__data,in_RSI);
  if (pMVar2 == (MemNode *)0x0) {
    local_34 = 3;
  }
  else {
    uVar3 = (ulong)((long)in_RSI - (long)(pMVar2->super_RbNode).mem) / pMVar2->density;
    uVar4 = uVar3 >> 6;
    local_98 = pMVar2->baUsed[uVar4];
    local_a0 = pMVar2->baCont[uVar4];
    local_a8 = 1L << ((byte)uVar3 & 0x3f);
    local_b0 = 0;
    local_90 = pMVar2->baCont + uVar4;
    local_88 = pMVar2->baUsed + uVar4;
    while (bVar5 = (local_a0 & local_a8) == 0, !bVar5) {
      local_b0 = local_b0 + 1;
      if (local_b0 == ((in_RDX + pMVar2->density) - 1) / pMVar2->density) {
        local_b0 = -1;
        goto LAB_001f2174;
      }
      local_a8 = local_a8 << 1;
      if (local_a8 == 0) {
        local_98 = local_88[1];
        local_a0 = local_90[1];
        local_a8 = 1;
        local_90 = local_90 + 1;
        local_88 = local_88 + 1;
      }
    }
    local_34 = 0;
  }
LAB_001f2284:
  pthread_mutex_unlock(__mutex);
  return local_34;
LAB_001f2174:
  local_a0 = (local_a8 ^ 0xffffffffffffffff) & local_a0;
  local_a8 = local_a8 << 1;
  local_b0 = local_b0 + 1;
  if ((bVar5) || (local_a8 == 0)) {
    *local_88 = local_98;
    *local_90 = local_a0;
    if (bVar5) goto LAB_001f2216;
    local_98 = local_88[1];
    local_a0 = local_90[1];
    local_a8 = 1;
    local_90 = local_90 + 1;
    local_88 = local_88 + 1;
  }
  bVar5 = (local_a0 & local_a8) == 0;
  local_98 = (local_a8 ^ 0xffffffffffffffff) & local_98;
  goto LAB_001f2174;
LAB_001f2216:
  local_b0 = pMVar2->density * local_b0;
  if (pMVar2->largestBlock < local_b0) {
    pMVar2->largestBlock = local_b0;
  }
  pMVar2->used = pMVar2->used - local_b0;
  *(ulong *)((long)in_RDI + 0x48) = *(long *)((long)in_RDI + 0x48) - local_b0;
  local_34 = 0;
  goto LAB_001f2284;
}

Assistant:

Error VMemMgr::shrink(void* p, size_t used) noexcept {
  if (!p) return kErrorOk;
  if (used == 0)
    return release(p);

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, (uint8_t*)p);
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  size_t usedBlocks = (used + node->density - 1) / node->density;

  bool stop;

  // Find the first block we can mark as free.
  for (;;) {
    stop = (cbits & bit) == 0;
    if (stop)
      return kErrorOk;

    if (++cont == usedBlocks)
      break;

    bit <<= 1;
    if (bit == 0) {
      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // Free the tail blocks.
  cont = ~(size_t)0;
  goto _EnterFreeLoop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;

_EnterFreeLoop:
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  return kErrorOk;
}